

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TerragenLoader.cpp
# Opt level: O0

void __thiscall
Assimp::TerragenImporter::InternReadFile
          (TerragenImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  int8_t iVar1;
  ushort uVar2;
  int16_t iVar3;
  uint uVar4;
  int iVar5;
  IOStream *stream;
  DeadlyImportError *pDVar6;
  int8_t *piVar7;
  aiNode *this_00;
  Logger *this_01;
  pointer pbVar8;
  aiMesh *this_02;
  ulong *puVar9;
  ulong uVar10;
  aiVector3t<float> *paVar11;
  void *pvVar12;
  aiFace *paVar13;
  aiVector3D *paVar14;
  float fVar15;
  aiVector3t<float> *local_410;
  aiVector3t<float> *local_3e8;
  aiFace *local_3c0;
  allocator local_2a9;
  string local_2a8;
  uint local_284;
  uint local_280;
  uint dtt;
  uint i;
  float local_274;
  aiVector3t<float> local_270;
  aiVector3t<float> local_264;
  aiVector3t<float> local_258;
  aiVector3t<float> local_24c;
  aiVector3t<float> local_240;
  aiVector3t<float> local_234;
  aiVector3t<float> local_228;
  int local_21c;
  int local_218;
  uint tmp2;
  uint tmp;
  float fx;
  float fy;
  uint xx;
  uint t;
  uint yy;
  int16_t *data;
  float step_x;
  float step_y;
  aiVector3D *uv;
  aiVector3D *pv;
  aiFace *f;
  aiMesh *m;
  string local_1c8;
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0;
  float local_180;
  float local_17c;
  float bheight;
  float hscale;
  char *head;
  aiNode *root;
  uint mode;
  uint y;
  uint x;
  undefined1 local_132;
  allocator local_131;
  string local_130;
  undefined1 local_10a;
  allocator local_109;
  string local_108;
  undefined1 local_e8 [8];
  StreamReaderLE reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  IOStream *local_30;
  IOStream *file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  TerragenImporter *this_local;
  
  file = (IOStream *)pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)pFile;
  pFile_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"rb",&local_51);
  stream = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = stream;
  if (stream == (IOStream *)0x0) {
    reader._55_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open TERRAGEN TERRAIN file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pScene_local
                  );
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar6,&local_88);
    reader._55_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  StreamReader<false,_false>::StreamReader((StreamReader<false,_false> *)local_e8,stream,false);
  uVar4 = StreamReader<false,_false>::GetRemainingSize((StreamReader<false,_false> *)local_e8);
  if (uVar4 < 0x10) {
    local_10a = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"TER: file is too small",&local_109);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_108);
    local_10a = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  piVar7 = StreamReader<false,_false>::GetPtr((StreamReader<false,_false> *)local_e8);
  iVar5 = strncmp(piVar7,"TERRAGEN",8);
  if (iVar5 != 0) {
    local_132 = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_130,"TER: Magic string \'TERRAGEN\' not found",&local_131);
    DeadlyImportError::DeadlyImportError(pDVar6,&local_130);
    local_132 = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  piVar7 = StreamReader<false,_false>::GetPtr((StreamReader<false,_false> *)local_e8);
  iVar5 = strncmp(piVar7 + 8,"TERRAIN ",8);
  if (iVar5 != 0) {
    y._2_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&x,"TER: Magic string \'TERRAIN\' not found",(allocator *)((long)&y + 3));
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)&x);
    y._2_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  mode = 0;
  root._4_4_ = 0;
  root._0_4_ = 0;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  (pIOHandler_local->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  head = (char *)this_00;
  aiString::Set((aiString *)this_00,"<TERRAGEN.TERRAIN>");
  head[0x42c] = '\0';
  head[0x42d] = '\0';
  head[0x42e] = -0x10;
  head[0x42f] = 'A';
  head[0x418] = '\0';
  head[0x419] = '\0';
  head[0x41a] = -0x10;
  head[0x41b] = 'A';
  head[0x404] = '\0';
  head[0x405] = '\0';
  head[0x406] = -0x10;
  head[0x407] = 'A';
  StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_e8,0x10);
  while (uVar4 = StreamReader<false,_false>::GetRemainingSize
                           ((StreamReader<false,_false> *)local_e8), 3 < uVar4) {
    _bheight = StreamReader<false,_false>::GetPtr((StreamReader<false,_false> *)local_e8);
    StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)local_e8,4);
    iVar5 = strncmp(_bheight,"EOF ",4);
    if (iVar5 == 0) break;
    iVar5 = strncmp(_bheight,"XPTS",4);
    if (iVar5 == 0) {
      uVar2 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_e8);
      mode = (uint)uVar2;
    }
    else {
      iVar5 = strncmp(_bheight,"YPTS",4);
      if (iVar5 == 0) {
        uVar2 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_e8);
        root._4_4_ = (uint)uVar2;
      }
      else {
        iVar5 = strncmp(_bheight,"SIZE",4);
        if (iVar5 == 0) {
          uVar2 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_e8);
          root._4_4_ = uVar2 + 1;
          mode = root._4_4_;
        }
        else {
          iVar5 = strncmp(_bheight,"SCAL",4);
          if (iVar5 == 0) {
            fVar15 = StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)local_e8);
            *(float *)(head + 0x404) = fVar15;
            fVar15 = StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)local_e8);
            *(float *)(head + 0x418) = fVar15;
            fVar15 = StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)local_e8);
            *(float *)(head + 0x42c) = fVar15;
          }
          else {
            iVar5 = strncmp(_bheight,"CRAD",4);
            if (iVar5 == 0) {
              StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)local_e8);
            }
            else {
              iVar5 = strncmp(_bheight,"CRVM",4);
              if (iVar5 == 0) {
                iVar1 = StreamReader<false,_false>::GetI1((StreamReader<false,_false> *)local_e8);
                root._0_4_ = (int)iVar1;
                if ((int)root != 0) {
                  this_01 = DefaultLogger::get();
                  Logger::error(this_01,"TER: Unsupported mapping mode, a flat terrain is returned")
                  ;
                }
              }
              else {
                iVar5 = strncmp(_bheight,"ALTW",4);
                if (iVar5 == 0) {
                  iVar3 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_e8);
                  local_17c = (float)(int)iVar3 * 1.5258789e-05;
                  iVar3 = StreamReader<false,_false>::GetI2((StreamReader<false,_false> *)local_e8);
                  local_180 = (float)(int)iVar3;
                  if ((local_17c == 0.0) && (!NAN(local_17c))) {
                    local_17c = 1.0;
                  }
                  uVar4 = StreamReader<false,_false>::GetRemainingSize
                                    ((StreamReader<false,_false> *)local_e8);
                  if (uVar4 < mode * root._4_4_ * 2) {
                    local_1a2 = 1;
                    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_1a0,"TER: ALTW chunk is too small",&local_1a1);
                    DeadlyImportError::DeadlyImportError(pDVar6,&local_1a0);
                    local_1a2 = 0;
                    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,
                                DeadlyImportError::~DeadlyImportError);
                  }
                  if ((mode < 2) || (root._4_4_ < 2)) {
                    m._6_1_ = 1;
                    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_1c8,"TER: Invalid terrain size",
                               (allocator *)((long)&m + 7));
                    DeadlyImportError::DeadlyImportError(pDVar6,&local_1c8);
                    m._6_1_ = 0;
                    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,
                                DeadlyImportError::~DeadlyImportError);
                  }
                  *(undefined4 *)
                   &(pIOHandler_local->m_pathStack).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = 1;
                  pbVar8 = (pointer)operator_new__(8);
                  (pIOHandler_local->m_pathStack).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar8;
                  this_02 = (aiMesh *)operator_new(0x520);
                  aiMesh::aiMesh(this_02);
                  *(aiMesh **)
                   (pIOHandler_local->m_pathStack).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage = this_02;
                  uVar4 = (mode - 1) * (root._4_4_ - 1);
                  this_02->mNumFaces = uVar4;
                  uVar10 = (ulong)uVar4;
                  f = (aiFace *)this_02;
                  puVar9 = (ulong *)operator_new__(uVar10 << 4 | 8);
                  *puVar9 = uVar10;
                  paVar13 = (aiFace *)(puVar9 + 1);
                  if (uVar10 != 0) {
                    local_3c0 = paVar13;
                    do {
                      aiFace::aiFace(local_3c0);
                      local_3c0 = local_3c0 + 1;
                    } while (local_3c0 != paVar13 + uVar10);
                  }
                  *(aiFace **)(f + 0xd) = paVar13;
                  uVar4 = *(int *)&f->mIndices << 2;
                  uVar10 = (ulong)uVar4;
                  *(uint *)&f->field_0x4 = uVar4;
                  pv = (aiVector3D *)paVar13;
                  paVar11 = (aiVector3t<float> *)operator_new__(uVar10 * 0xc);
                  if (uVar10 != 0) {
                    local_3e8 = paVar11;
                    do {
                      aiVector3t<float>::aiVector3t(local_3e8);
                      local_3e8 = local_3e8 + 1;
                    } while (local_3e8 != paVar11 + uVar10);
                  }
                  *(aiVector3t<float> **)(f + 1) = paVar11;
                  _step_x = (aiVector3t<float> *)0x0;
                  data._4_4_ = 0.0;
                  data._0_4_ = 0.0;
                  uv = paVar11;
                  if ((this->configComputeUVs & 1U) != 0) {
                    uVar10 = (ulong)*(uint *)&f->field_0x4;
                    paVar11 = (aiVector3t<float> *)operator_new__(uVar10 * 0xc);
                    if (uVar10 != 0) {
                      local_410 = paVar11;
                      do {
                        aiVector3t<float>::aiVector3t(local_410);
                        local_410 = local_410 + 1;
                      } while (local_410 != paVar11 + uVar10);
                    }
                    *(aiVector3t<float> **)(f + 7) = paVar11;
                    data._4_4_ = 1.0 / (float)root._4_4_;
                    data._0_4_ = 1.0 / (float)mode;
                    _step_x = paVar11;
                  }
                  _t = StreamReader<false,_false>::GetPtr((StreamReader<false,_false> *)local_e8);
                  fy = 0.0;
                  for (xx = 0; xx < root._4_4_ - 1; xx = xx + 1) {
                    for (fx = 0.0; (uint)fx < mode - 1; fx = (float)((int)fx + 1)) {
                      tmp = (uint)(float)xx;
                      tmp2 = (uint)(float)(uint)fx;
                      local_21c = mode * xx;
                      aiVector3t<float>::aiVector3t
                                (&local_228,(float)tmp2,(float)tmp,
                                 (float)(int)*(short *)(_t + (ulong)(uint)(local_21c + (int)fx) * 2)
                                 * local_17c + local_180);
                      uv->z = local_228.z;
                      uv->x = local_228.x;
                      uv->y = local_228.y;
                      local_218 = mode * (xx + 1);
                      uv = uv + 1;
                      aiVector3t<float>::aiVector3t
                                (&local_234,(float)tmp2,(float)tmp + 1.0,
                                 (float)(int)*(short *)(_t + (ulong)(uint)(local_218 + (int)fx) * 2)
                                 * local_17c + local_180);
                      uv->z = local_234.z;
                      uv->x = local_234.x;
                      uv->y = local_234.y;
                      uv = uv + 1;
                      aiVector3t<float>::aiVector3t
                                (&local_240,(float)tmp2 + 1.0,(float)tmp + 1.0,
                                 (float)(int)*(short *)(_t + (ulong)(uint)(local_218 + 1 + (int)fx)
                                                             * 2) * local_17c + local_180);
                      uv->z = local_240.z;
                      uv->x = local_240.x;
                      uv->y = local_240.y;
                      uv = uv + 1;
                      aiVector3t<float>::aiVector3t
                                (&local_24c,(float)tmp2 + 1.0,(float)tmp,
                                 (float)(int)*(short *)(_t + (ulong)(uint)(local_21c + 1 + (int)fx)
                                                             * 2) * local_17c + local_180);
                      paVar14 = uv + 1;
                      uv->x = local_24c.x;
                      uv->y = local_24c.y;
                      uv->z = local_24c.z;
                      uv = paVar14;
                      if ((this->configComputeUVs & 1U) != 0) {
                        aiVector3t<float>::aiVector3t
                                  (&local_258,data._0_4_ * (float)(uint)fx,data._4_4_ * (float)xx,
                                   0.0);
                        _step_x->z = local_258.z;
                        _step_x->x = local_258.x;
                        _step_x->y = local_258.y;
                        _step_x = _step_x + 1;
                        aiVector3t<float>::aiVector3t
                                  (&local_264,data._0_4_ * (float)(uint)fx,
                                   data._4_4_ * (float)(xx + 1),0.0);
                        _step_x->z = local_264.z;
                        _step_x->x = local_264.x;
                        _step_x->y = local_264.y;
                        _step_x = _step_x + 1;
                        aiVector3t<float>::aiVector3t
                                  (&local_270,data._0_4_ * (float)((int)fx + 1),
                                   data._4_4_ * (float)(xx + 1),0.0);
                        _step_x->z = local_270.z;
                        _step_x->x = local_270.x;
                        _step_x->y = local_270.y;
                        _step_x = _step_x + 1;
                        aiVector3t<float>::aiVector3t
                                  ((aiVector3t<float> *)&dtt,data._0_4_ * (float)((int)fx + 1),
                                   data._4_4_ * (float)xx,0.0);
                        _step_x->x = (float)dtt;
                        _step_x->y = (float)i;
                        _step_x->z = local_274;
                        _step_x = _step_x + 1;
                      }
                      pv->x = 5.60519e-45;
                      pvVar12 = operator_new__(0x10);
                      *(void **)&pv->z = pvVar12;
                      for (local_280 = 0; local_280 < 4; local_280 = local_280 + 1) {
                        *(float *)(*(long *)&pv->z + (ulong)local_280 * 4) = fy;
                        fy = (float)((int)fy + 1);
                      }
                      pv = (aiVector3D *)&pv[1].y;
                    }
                  }
                  head[0x460] = '\x01';
                  head[0x461] = '\0';
                  head[0x462] = '\0';
                  head[0x463] = '\0';
                  pvVar12 = operator_new__(4);
                  *(void **)(head + 0x468) = pvVar12;
                  **(undefined4 **)(head + 0x468) = 0;
                }
              }
            }
          }
        }
      }
    }
    local_284 = StreamReader<false,_false>::GetCurrentPos((StreamReader<false,_false> *)local_e8);
    local_284 = local_284 & 3;
    if (local_284 != 0) {
      StreamReader<false,_false>::IncPtr
                ((StreamReader<false,_false> *)local_e8,(ulong)(4 - local_284));
    }
  }
  if (*(int *)&(pIOHandler_local->m_pathStack).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish == 1) {
    *(uint *)&pIOHandler_local->_vptr_IOSystem = *(uint *)&pIOHandler_local->_vptr_IOSystem | 0x10;
    StreamReader<false,_false>::~StreamReader((StreamReader<false,_false> *)local_e8);
    return;
  }
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"TER: Unable to load terrain",&local_2a9);
  DeadlyImportError::DeadlyImportError(pDVar6,&local_2a8);
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void TerragenImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    IOStream* file = pIOHandler->Open( pFile, "rb");

    // Check whether we can read from the file
    if( file == NULL)
        throw DeadlyImportError( "Failed to open TERRAGEN TERRAIN file " + pFile + ".");

    // Construct a stream reader to read all data in the correct endianness
    StreamReaderLE reader(file);
    if(reader.GetRemainingSize() < 16)
        throw DeadlyImportError( "TER: file is too small" );

    // Check for the existence of the two magic strings 'TERRAGEN' and 'TERRAIN '
    if (::strncmp((const char*)reader.GetPtr(),AI_TERR_BASE_STRING,8))
        throw DeadlyImportError( "TER: Magic string \'TERRAGEN\' not found" );

    if (::strncmp((const char*)reader.GetPtr()+8,AI_TERR_TERRAIN_STRING,8))
        throw DeadlyImportError( "TER: Magic string \'TERRAIN\' not found" );

    unsigned int x = 0,y = 0,mode = 0;

    aiNode* root = pScene->mRootNode = new aiNode();
    root->mName.Set("<TERRAGEN.TERRAIN>");

    // Default scaling is 30
    root->mTransformation.a1 = root->mTransformation.b2 = root->mTransformation.c3 = 30.f;

    // Now read all chunks until we're finished or an EOF marker is encountered
    reader.IncPtr(16);
    while (reader.GetRemainingSize() >= 4)
    {
        const char* head = (const char*)reader.GetPtr();
        reader.IncPtr(4);

        // EOF, break in every case
        if (!::strncmp(head,AI_TERR_EOF_STRING,4))
            break;

        // Number of x-data points
        if (!::strncmp(head,AI_TERR_CHUNK_XPTS,4))
        {
            x = (uint16_t)reader.GetI2();
        }
        // Number of y-data points
        else if (!::strncmp(head,AI_TERR_CHUNK_YPTS,4))
        {
            y = (uint16_t)reader.GetI2();
        }
        // Squared terrains width-1.
        else if (!::strncmp(head,AI_TERR_CHUNK_SIZE,4))
        {
            x = y = (uint16_t)reader.GetI2()+1;
        }
        // terrain scaling
        else if (!::strncmp(head,AI_TERR_CHUNK_SCAL,4))
        {
            root->mTransformation.a1 = reader.GetF4();
            root->mTransformation.b2 = reader.GetF4();
            root->mTransformation.c3 = reader.GetF4();
        }
        // mapping == 1: earth radius
        else if (!::strncmp(head,AI_TERR_CHUNK_CRAD,4))
        {
            reader.GetF4();
        }
        // mapping mode
        else if (!::strncmp(head,AI_TERR_CHUNK_CRVM,4))
        {
            mode = reader.GetI1();
            if (0 != mode)
                ASSIMP_LOG_ERROR("TER: Unsupported mapping mode, a flat terrain is returned");
        }
        // actual terrain data
        else if (!::strncmp(head,AI_TERR_CHUNK_ALTW,4))
        {
            float hscale  = (float)reader.GetI2()  / 65536;
            float bheight = (float)reader.GetI2();

            if (!hscale)hscale = 1;

            // Ensure we have enough data
            if (reader.GetRemainingSize() < x*y*2)
                throw DeadlyImportError("TER: ALTW chunk is too small");

            if (x <= 1 || y <= 1)
                throw DeadlyImportError("TER: Invalid terrain size");

            // Allocate the output mesh
            pScene->mMeshes = new aiMesh*[pScene->mNumMeshes = 1];
            aiMesh* m = pScene->mMeshes[0] = new aiMesh();

            // We return quads
            aiFace* f = m->mFaces = new aiFace[m->mNumFaces = (x-1)*(y-1)];
            aiVector3D* pv = m->mVertices = new aiVector3D[m->mNumVertices = m->mNumFaces*4];

            aiVector3D *uv( NULL );
            float step_y( 0.0f ), step_x( 0.0f );
            if (configComputeUVs) {
                uv = m->mTextureCoords[0] = new aiVector3D[m->mNumVertices];
                step_y = 1.f/y;
                step_x = 1.f/x;
            }
            const int16_t* data = (const int16_t*)reader.GetPtr();

            for (unsigned int yy = 0, t = 0; yy < y-1;++yy) {
                for (unsigned int xx = 0; xx < x-1;++xx,++f)    {

                    // make verts
                    const float fy = (float)yy, fx = (float)xx;
                    unsigned tmp,tmp2;
                    *pv++ = aiVector3D(fx,fy,    (float)data[(tmp2=x*yy)    + xx] * hscale + bheight);
                    *pv++ = aiVector3D(fx,fy+1,  (float)data[(tmp=x*(yy+1)) + xx] * hscale + bheight);
                    *pv++ = aiVector3D(fx+1,fy+1,(float)data[tmp  + xx+1]         * hscale + bheight);
                    *pv++ = aiVector3D(fx+1,fy,  (float)data[tmp2 + xx+1]         * hscale + bheight);

                    // also make texture coordinates, if necessary
                    if (configComputeUVs) {
                        *uv++ = aiVector3D( step_x*xx,     step_y*yy,     0.f );
                        *uv++ = aiVector3D( step_x*xx,     step_y*(yy+1), 0.f );
                        *uv++ = aiVector3D( step_x*(xx+1), step_y*(yy+1), 0.f );
                        *uv++ = aiVector3D( step_x*(xx+1), step_y*yy,     0.f );
                    }

                    // make indices
                    f->mIndices = new unsigned int[f->mNumIndices = 4];
                    for (unsigned int i = 0; i < 4;++i)
                        f->mIndices[i] = t++;
                }
            }

            // Add the mesh to the root node
            root->mMeshes = new unsigned int[root->mNumMeshes = 1];
            root->mMeshes[0] = 0;
        }

        // Get to the next chunk (4 byte aligned)
        unsigned dtt;
        if ((dtt = reader.GetCurrentPos() & 0x3))
            reader.IncPtr(4-dtt);
    }

    // Check whether we have a mesh now
    if (pScene->mNumMeshes != 1)
        throw DeadlyImportError("TER: Unable to load terrain");

    // Set the AI_SCENE_FLAGS_TERRAIN bit
    pScene->mFlags |= AI_SCENE_FLAGS_TERRAIN;
}